

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O3

int32_t __thiscall cab::calculate_costs(cab *this,node_type src,node_type dst)

{
  node_type *pnVar1;
  node_type *pnVar2;
  road_network *prVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  node_type nVar8;
  bool bVar9;
  node_type nVar10;
  node_type nVar11;
  node_type *pnVar12;
  pointer prVar13;
  request r;
  uint32_t local_6c;
  request local_58;
  uint local_40;
  uint local_3c;
  pointer local_38;
  
  pnVar1 = (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pnVar2 = (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_3c = 0;
  if (pnVar1 == pnVar2) {
    bVar5 = true;
    bVar6 = false;
  }
  else {
    bVar6 = false;
    bVar4 = 0;
    do {
      pnVar12 = pnVar1 + 1;
      bVar6 = (bool)(*pnVar1 == src | bVar6);
      bVar4 = *pnVar1 == dst & bVar6 | bVar4;
      if ((bool)(bVar6 & bVar4)) break;
      pnVar1 = pnVar12;
    } while (pnVar12 != pnVar2);
    if ((bool)(bVar6 & bVar4)) {
      return this->_costs;
    }
    bVar5 = (bool)(bVar4 ^ 1);
  }
  prVar13 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (prVar13 != local_38) {
    local_3c = 0;
    local_40 = (uint)dst;
    do {
      local_58._src = prVar13->_src;
      local_58._dst = prVar13->_dst;
      local_58._2_2_ = *(undefined2 *)&prVar13->field_0x2;
      local_58._passengers = prVar13->_passengers;
      local_58._detours = prVar13->_detours;
      local_58._picked_up = prVar13->_picked_up;
      local_58._13_3_ = *(undefined3 *)&prVar13->field_0xd;
      local_6c = request::detours(&local_58);
      bVar7 = road_network::is_inner(this->_rnet,src);
      if (!bVar6) {
        prVar3 = this->_rnet;
        nVar10 = this->_position;
        nVar8 = request::src(&local_58);
        bVar9 = road_network::in_between(prVar3,nVar10,nVar8,src);
        if (!bVar9) {
          prVar3 = this->_rnet;
          nVar10 = request::src(&local_58);
          nVar8 = request::dst(&local_58);
          bVar9 = road_network::in_between(prVar3,nVar10,nVar8,src);
          if (!bVar9) goto LAB_0011d051;
        }
        local_6c = (local_6c - bVar7) + 2;
      }
LAB_0011d051:
      nVar10 = (node_type)local_40;
      bVar7 = road_network::is_inner(this->_rnet,nVar10);
      if (bVar5) {
        prVar3 = this->_rnet;
        nVar8 = this->_position;
        nVar11 = request::src(&local_58);
        bVar9 = road_network::in_between(prVar3,nVar8,nVar11,nVar10);
        if (!bVar9) {
          prVar3 = this->_rnet;
          nVar8 = request::src(&local_58);
          nVar11 = request::dst(&local_58);
          bVar9 = road_network::in_between(prVar3,nVar8,nVar11,nVar10);
          if (!bVar9) goto LAB_0011d0f9;
        }
        local_6c = (local_6c - bVar7) + 2;
      }
LAB_0011d0f9:
      if (local_3c < local_6c) {
        local_3c = local_6c;
      }
      prVar13 = prVar13 + 1;
    } while (prVar13 != local_38);
  }
  return local_3c;
}

Assistant:

std::int32_t cab::calculate_costs(node_type src, node_type dst)
{
    // check if the cab already has src and dst in that order in its requests
    std::pair<bool, bool> pair = route_contains_ordered(src, dst);
    bool found_src = pair.first;
    bool found_dst = pair.second;

    if(found_src && found_dst)
    {
        return _costs;
    }

    // calculate and return max detour costs
    std::uint32_t max = 0;
    for(auto r : _requests)
    {
        std::uint32_t cost = r.detours();
        bool is_inner = _rnet->is_inner(src); 
        // if cab stops at src before r.src() add 1 to r.detours() if src is on a inner edge
        // add 2 to r.detours() if src is on a outer edge
        // this accounts for the longer drive
        if(!found_src && (_rnet->in_between(_position, r.src(), src) || 
                _rnet->in_between(r.src(), r.dst(), src)))
        {
            cost = is_inner ? cost + 1 : cost + 2;
        }

        is_inner = _rnet->is_inner(dst); 
        // same as above but with dst
        if(!found_dst && (_rnet->in_between(_position, r.src(), dst) || 
                _rnet->in_between(r.src(), r.dst(), dst)))
        {
            cost = is_inner ? cost + 1 : cost + 2;
        }
        
        max = cost > max ? cost : max;
    }

    return max;
}